

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_pigpiod_if.c
# Opt level: O0

void ta(void)

{
  int st;
  size_t sVar1;
  char text [2048];
  char *TEXT;
  int e;
  int b;
  int h;
  char *in_stack_fffffffffffff7b8;
  int in_stack_fffffffffffff7c4;
  int pc;
  undefined8 in_stack_fffffffffffff7c8;
  char *pcVar2;
  int in_stack_fffffffffffff7d0;
  int in_stack_fffffffffffff7d4;
  int t;
  char local_818 [2048];
  char *local_18;
  undefined4 local_c;
  int local_8;
  int local_4;
  
  printf("Serial link tests.\n");
  local_4 = serial_open("/dev/ttyAMA0",0xe100,0);
  CHECK(in_stack_fffffffffffff7d4,in_stack_fffffffffffff7d0,
        (int)((ulong)in_stack_fffffffffffff7c8 >> 0x20),(int)in_stack_fffffffffffff7c8,
        in_stack_fffffffffffff7c4,in_stack_fffffffffffff7b8);
  time_sleep(0x3fb999999999999a);
  local_8 = serial_read(local_4,local_818,0x800);
  local_8 = serial_data_available(local_4);
  CHECK(in_stack_fffffffffffff7d4,in_stack_fffffffffffff7d0,
        (int)((ulong)in_stack_fffffffffffff7c8 >> 0x20),(int)in_stack_fffffffffffff7c8,
        in_stack_fffffffffffff7c4,in_stack_fffffffffffff7b8);
  local_18 = 
  "To be, or not to be, that is the question-Whether \'tis Nobler in the mind to sufferThe Slings and Arrows of outrageous Fortune,Or to take Arms against a Sea of troubles,"
  ;
  pcVar2 = 
  "To be, or not to be, that is the question-Whether \'tis Nobler in the mind to sufferThe Slings and Arrows of outrageous Fortune,Or to take Arms against a Sea of troubles,"
  ;
  pc = local_4;
  sVar1 = strlen(
                "To be, or not to be, that is the question-Whether \'tis Nobler in the mind to sufferThe Slings and Arrows of outrageous Fortune,Or to take Arms against a Sea of troubles,"
                );
  local_c = serial_write(pc,pcVar2,sVar1 & 0xffffffff);
  CHECK(in_stack_fffffffffffff7d4,in_stack_fffffffffffff7d0,(int)((ulong)pcVar2 >> 0x20),(int)pcVar2
        ,pc,in_stack_fffffffffffff7b8);
  local_c = serial_write_byte(local_4,0xaa);
  local_c = serial_write_byte(local_4,0x55);
  local_c = serial_write_byte(local_4,0);
  local_c = serial_write_byte(local_4,0xff);
  CHECK(in_stack_fffffffffffff7d4,in_stack_fffffffffffff7d0,(int)((ulong)pcVar2 >> 0x20),(int)pcVar2
        ,pc,in_stack_fffffffffffff7b8);
  time_sleep(0x3fb999999999999a);
  st = serial_data_available(local_4);
  local_8 = st;
  strlen(local_18);
  CHECK(in_stack_fffffffffffff7d4,st,(int)((ulong)pcVar2 >> 0x20),(int)pcVar2,pc,
        in_stack_fffffffffffff7b8);
  t = local_4;
  sVar1 = strlen(local_18);
  local_8 = serial_read(t,local_818,sVar1 & 0xffffffff);
  strlen(local_18);
  CHECK(t,st,(int)((ulong)pcVar2 >> 0x20),(int)pcVar2,pc,in_stack_fffffffffffff7b8);
  if (-1 < local_8) {
    local_818[local_8] = '\0';
  }
  strcmp(local_18,local_818);
  CHECK(t,st,(int)((ulong)pcVar2 >> 0x20),(int)pcVar2,pc,in_stack_fffffffffffff7b8);
  local_8 = serial_read_byte(local_4);
  CHECK(t,st,(int)((ulong)pcVar2 >> 0x20),(int)pcVar2,pc,in_stack_fffffffffffff7b8);
  local_8 = serial_read_byte(local_4);
  CHECK(t,st,(int)((ulong)pcVar2 >> 0x20),(int)pcVar2,pc,in_stack_fffffffffffff7b8);
  local_8 = serial_read_byte(local_4);
  CHECK(t,st,(int)((ulong)pcVar2 >> 0x20),(int)pcVar2,pc,in_stack_fffffffffffff7b8);
  local_8 = serial_read_byte(local_4);
  CHECK(t,st,(int)((ulong)pcVar2 >> 0x20),(int)pcVar2,pc,in_stack_fffffffffffff7b8);
  local_8 = serial_data_available(local_4);
  CHECK(t,st,(int)((ulong)pcVar2 >> 0x20),(int)pcVar2,pc,in_stack_fffffffffffff7b8);
  local_c = serial_close(local_4);
  CHECK(t,st,(int)((ulong)pcVar2 >> 0x20),(int)pcVar2,pc,in_stack_fffffffffffff7b8);
  return;
}

Assistant:

void ta()
{
   int h, b, e;
   char *TEXT;
   char text[2048];

   printf("Serial link tests.\n");

   /* this test needs RXD and TXD to be connected */

   h = serial_open("/dev/ttyAMA0", 57600, 0);

   CHECK(10, 1, h, 0, 0, "serial open");

   time_sleep(0.1); /* allow time for transmission */

   b = serial_read(h, text, sizeof(text)); /* flush buffer */

   b = serial_data_available(h);
   CHECK(10, 2, b, 0, 0, "serial data available");

   TEXT = "\
To be, or not to be, that is the question-\
Whether 'tis Nobler in the mind to suffer\
The Slings and Arrows of outrageous Fortune,\
Or to take Arms against a Sea of troubles,\
";
   e = serial_write(h, TEXT, strlen(TEXT));
   CHECK(10, 3, e, 0, 0, "serial write");

   e = serial_write_byte(h, 0xAA);
   e = serial_write_byte(h, 0x55);
   e = serial_write_byte(h, 0x00);
   e = serial_write_byte(h, 0xFF);

   CHECK(10, 4, e, 0, 0, "serial write byte");

   time_sleep(0.1); /* allow time for transmission */

   b = serial_data_available(h);
   CHECK(10, 5, b, strlen(TEXT)+4, 0, "serial data available");

   b = serial_read(h, text, strlen(TEXT));
   CHECK(10, 6, b, strlen(TEXT), 0, "serial read");
   if (b >= 0) text[b] = 0;
   CHECK(10, 7, strcmp(TEXT, text), 0, 0, "serial read");

   b = serial_read_byte(h);
   CHECK(10, 8, b, 0xAA, 0, "serial read byte");

   b = serial_read_byte(h);
   CHECK(10, 9, b, 0x55, 0, "serial read byte");

   b = serial_read_byte(h);
   CHECK(10, 10, b, 0x00, 0, "serial read byte");

   b = serial_read_byte(h);
   CHECK(10, 11, b, 0xFF, 0, "serial read byte");

   b = serial_data_available(h);
   CHECK(10, 12, b, 0, 0, "serial data availabe");

   e = serial_close(h);
   CHECK(10, 13, e, 0, 0, "serial close");
}